

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int close_set_error(CLOSE_HANDLE close,ERROR_HANDLE error_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE error_amqp_value;
  CLOSE_INSTANCE *close_instance;
  int result;
  ERROR_HANDLE error_value_local;
  CLOSE_HANDLE close_local;
  
  if (close == (CLOSE_HANDLE)0x0) {
    close_instance._4_4_ = 0x2762;
  }
  else {
    item_value = amqpvalue_create_error(error_value);
    if (item_value == (AMQP_VALUE)0x0) {
      close_instance._4_4_ = 0x276a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(close->composite_value,0,item_value);
      if (iVar1 == 0) {
        close_instance._4_4_ = 0;
      }
      else {
        close_instance._4_4_ = 0x2770;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return close_instance._4_4_;
}

Assistant:

int close_set_error(CLOSE_HANDLE close, ERROR_HANDLE error_value)
{
    int result;

    if (close == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        AMQP_VALUE error_amqp_value = amqpvalue_create_error(error_value);
        if (error_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(close_instance->composite_value, 0, error_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(error_amqp_value);
        }
    }

    return result;
}